

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O1

void ZopfliLZ77OptimalFixed
               (ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,ZopfliLZ77Store *store)

{
  unsigned_short *length_array;
  float *costs;
  size_t pathsize;
  unsigned_short *path;
  ZopfliHash hash;
  
  length_array = (unsigned_short *)malloc((inend - instart) * 2 + 2);
  path = (unsigned_short *)0x0;
  pathsize = 0;
  costs = (float *)malloc((inend - instart) * 4 + 4);
  if ((costs != (float *)0x0) && (length_array != (unsigned_short *)0x0)) {
    ZopfliAllocHash(0x8000,&hash);
    s->blockstart = instart;
    s->blockend = inend;
    LZ77OptimalRun(s,in,instart,inend,&path,&pathsize,length_array,GetCostFixed,(void *)0x0,store,
                   &hash,costs);
    free(length_array);
    free(path);
    free(costs);
    ZopfliCleanHash(&hash);
    return;
  }
  exit(-1);
}

Assistant:

void ZopfliLZ77OptimalFixed(ZopfliBlockState *s,
                            const unsigned char* in,
                            size_t instart, size_t inend,
                            ZopfliLZ77Store* store)
{
  /* Dist to get to here with smallest cost. */
  size_t blocksize = inend - instart;
  unsigned short* length_array =
      (unsigned short*)malloc(sizeof(unsigned short) * (blocksize + 1));
  unsigned short* path = 0;
  size_t pathsize = 0;
  ZopfliHash hash;
  ZopfliHash* h = &hash;
  float* costs = (float*)malloc(sizeof(float) * (blocksize + 1));

  if (!costs) exit(-1); /* Allocation failed. */
  if (!length_array) exit(-1); /* Allocation failed. */

  ZopfliAllocHash(ZOPFLI_WINDOW_SIZE, h);

  s->blockstart = instart;
  s->blockend = inend;

  /* Shortest path for fixed tree This one should give the shortest possible
  result for fixed tree, no repeated runs are needed since the tree is known. */
  LZ77OptimalRun(s, in, instart, inend, &path, &pathsize,
                 length_array, GetCostFixed, 0, store, h, costs);

  free(length_array);
  free(path);
  free(costs);
  ZopfliCleanHash(h);
}